

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Volume.h
# Opt level: O2

extent idx2::Crop<idx2::extent,idx2::extent>(extent *Grid1,extent *Grid2)

{
  u64 uVar1;
  u64 uVar2;
  u64 uVar3;
  u64 uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  int iVar13;
  ulong uVar14;
  int iVar15;
  extent eVar16;
  
  uVar1 = Grid1->From;
  uVar2 = Grid1->Dims;
  uVar10 = (long)(uVar1 << 0x2b) >> 0x2b;
  uVar12 = (long)(uVar1 * 2) >> 0x2b;
  uVar3 = Grid2->From;
  uVar4 = Grid2->Dims;
  uVar14 = (long)(uVar3 << 0x2b) >> 0x2b;
  uVar8 = (long)(uVar3 * 2) >> 0x2b;
  if ((long)uVar14 < (long)uVar10) {
    uVar14 = uVar10;
  }
  uVar5 = (uint)((long)(uVar1 << 0x16) >> 0x2b);
  uVar6 = (uint)((long)(uVar3 << 0x16) >> 0x2b);
  if ((int)uVar6 < (int)uVar5) {
    uVar6 = uVar5;
  }
  if ((long)uVar8 < (long)uVar12) {
    uVar8 = uVar12;
  }
  iVar11 = (int)((long)(uVar1 * 2) >> 0x2b) + (int)((long)(uVar2 * 2) >> 0x2b) + -1;
  iVar7 = (int)((long)(uVar3 * 2) >> 0x2b) + (int)((long)(uVar4 * 2) >> 0x2b) + -1;
  iVar13 = (((int)uVar4 << 0xb) >> 0xb) + (int)((long)(uVar3 << 0x2b) >> 0x2b) + -1;
  iVar9 = (int)((long)(uVar1 << 0x2b) >> 0x2b) + (((int)uVar2 << 0xb) >> 0xb) + -1;
  if (iVar13 < iVar9) {
    iVar9 = iVar13;
  }
  iVar15 = (int)(((long)(uVar4 << 0x16) >> 0xb) + -0x100000000 +
                 ((long)(uVar3 << 0x16) >> 0xb & 0xffffffff00000000U) >> 0x20);
  iVar13 = (int)(((long)(uVar2 << 0x16) >> 0xb) + -0x100000000 +
                 ((long)(uVar1 << 0x16) >> 0xb & 0xffffffff00000000U) >> 0x20);
  if (iVar15 < iVar13) {
    iVar13 = iVar15;
  }
  if (iVar7 < iVar11) {
    iVar11 = iVar7;
  }
  uVar10 = 0;
  if ((iVar9 < (int)uVar14) || (iVar13 < (int)uVar6)) {
    uVar12 = 0;
  }
  else {
    uVar12 = 0;
    if ((int)uVar8 <= iVar11) {
      uVar12 = CONCAT44((iVar13 - uVar6) + 1,(iVar9 - (int)uVar14) + 1);
      uVar10 = (ulong)((iVar11 - (int)uVar8) + 1U & 0x1fffff) << 0x2a;
    }
  }
  eVar16.From = (uVar8 & 0x1fffff) << 0x2a | uVar14 & 0x1fffff | (ulong)(uVar6 & 0x1fffff) << 0x15;
  eVar16.Dims = uVar12 >> 0xb & 0x3ffffe00000 | uVar12 & 0x1fffff | uVar10;
  return eVar16;
}

Assistant:

idx2_Inline v3i
From(const extent& Ext)
{
  return Unpack3i64(Ext.From);
}